

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

void Dar_BalanceCone_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Aig_Type_t AVar2;
  Aig_Type_t AVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pObj_local;
  Aig_Obj_t *pRoot_local;
  
  if (pObj == pRoot) {
LAB_006161aa:
    iVar1 = Aig_IsComplement(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x70,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x71,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pAVar4 = Aig_ObjChild0(pObj);
    pAVar4 = Aig_ObjReal_rec(pAVar4);
    Dar_BalanceCone_rec(pRoot,pAVar4,vSuper);
    pAVar4 = Aig_ObjChild1(pObj);
    pAVar4 = Aig_ObjReal_rec(pAVar4);
    Dar_BalanceCone_rec(pRoot,pAVar4,vSuper);
  }
  else {
    iVar1 = Aig_IsComplement(pObj);
    if (iVar1 == 0) {
      AVar2 = Aig_ObjType(pObj);
      AVar3 = Aig_ObjType(pRoot);
      if (AVar2 == AVar3) {
        iVar1 = Aig_ObjRefs(pObj);
        if (iVar1 < 2) {
          iVar1 = Vec_PtrSize(vSuper);
          if (iVar1 < 0x2711) goto LAB_006161aa;
        }
      }
    }
    Vec_PtrPush(vSuper,pObj);
  }
  return;
}

Assistant:

void Dar_BalanceCone_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pObj != pRoot && (Aig_IsComplement(pObj) || Aig_ObjType(pObj) != Aig_ObjType(pRoot) || Aig_ObjRefs(pObj) > 1 || Vec_PtrSize(vSuper) > 10000) )
        Vec_PtrPush( vSuper, pObj );
    else
    {
        assert( !Aig_IsComplement(pObj) );
        assert( Aig_ObjIsNode(pObj) );
        // go through the branches
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild0(pObj) ), vSuper );
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild1(pObj) ), vSuper );
    }
}